

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

FieldSubset * __thiscall
capnp::StructSchema::getUnionFields(FieldSubset *__return_storage_ptr__,StructSchema *this)

{
  RawBrandedSchema *pRVar1;
  uint16_t *puVar2;
  void *pvVar3;
  uint uVar4;
  ListReader local_b8;
  StructReader local_88;
  PointerReader local_58;
  
  local_58.pointer = (WirePointer *)((this->super_Schema).raw)->generic->encodedNode;
  local_58.segment = (SegmentReader *)0x0;
  local_58.capTable = (CapTableReader *)0x0;
  local_58.nestingLimit = 0x7fffffff;
  uVar4 = 0;
  _::PointerReader::getStruct(&local_88,&local_58,(word *)0x0);
  pvVar3 = local_88.data;
  local_88.data = (void *)(CONCAT44(local_88.pointers._4_4_,(int)local_88.pointers) + 0x18);
  local_88.pointers._0_4_ = local_88.nestingLimit;
  if (local_88.pointerCount < 4) {
    local_88.segment._0_4_ = 0;
    local_88.segment._4_4_ = 0;
    local_88.capTable._0_4_ = 0;
    local_88.capTable._4_4_ = 0;
    local_88.data = (void *)0x0;
    local_88.pointers._0_4_ = 0x7fffffff;
  }
  pRVar1 = (this->super_Schema).raw;
  _::PointerReader::getList(&local_b8,(PointerReader *)&local_88,INLINE_COMPOSITE,(word *)0x0);
  puVar2 = ((this->super_Schema).raw)->generic->membersByDiscriminant;
  if (0xff < local_88.dataSize) {
    uVar4 = (uint)*(ushort *)((long)pvVar3 + 0x1e);
  }
  (__return_storage_ptr__->list).reader.structDataSize = local_b8.structDataSize;
  (__return_storage_ptr__->list).reader.structPointerCount = local_b8.structPointerCount;
  (__return_storage_ptr__->list).reader.elementSize = local_b8.elementSize;
  (__return_storage_ptr__->list).reader.field_0x27 = local_b8._39_1_;
  (__return_storage_ptr__->list).reader.nestingLimit = local_b8.nestingLimit;
  *(undefined4 *)&(__return_storage_ptr__->list).reader.field_0x2c = local_b8._44_4_;
  (__return_storage_ptr__->list).reader.ptr = local_b8.ptr;
  (__return_storage_ptr__->list).reader.elementCount = local_b8.elementCount;
  (__return_storage_ptr__->list).reader.step = local_b8.step;
  (__return_storage_ptr__->list).reader.segment = local_b8.segment;
  (__return_storage_ptr__->list).reader.capTable = local_b8.capTable;
  (__return_storage_ptr__->parent).super_Schema.raw = pRVar1;
  __return_storage_ptr__->indices = puVar2;
  __return_storage_ptr__->size_ = uVar4;
  return __return_storage_ptr__;
}

Assistant:

StructSchema::FieldSubset StructSchema::getUnionFields() const {
  auto proto = getProto().getStruct();
  return FieldSubset(*this, proto.getFields(),
                     raw->generic->membersByDiscriminant, proto.getDiscriminantCount());
}